

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint value;
  uint value_00;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uivector nextcode;
  uivector blcount;
  
  blcount.allocsize = 0;
  nextcode.allocsize = 0;
  blcount.data = (uint *)0x0;
  blcount.size = 0;
  nextcode.data = (uint *)0x0;
  nextcode.size = 0;
  puVar4 = (uint *)malloc((ulong)tree->numcodes << 2);
  tree->tree1d = puVar4;
  uVar3 = uivector_resizev(&blcount,(ulong)(tree->maxbitlen + 1),value);
  if (((uVar3 == 0) ||
      (uVar3 = uivector_resizev(&nextcode,(ulong)(tree->maxbitlen + 1),value_00),
      puVar4 == (uint *)0x0)) || (uVar3 == 0)) {
    uivector_cleanup(&blcount);
    uivector_cleanup(&nextcode);
  }
  else {
    for (uVar5 = 0; uVar5 < tree->numcodes; uVar5 = uVar5 + 1) {
      blcount.data[tree->lengths[uVar5]] = blcount.data[tree->lengths[uVar5]] + 1;
    }
    uVar5 = 0;
    while (uVar3 = (int)uVar5 + 1, uVar3 <= tree->maxbitlen) {
      nextcode.data[uVar3] = (blcount.data[uVar5] + nextcode.data[uVar5]) * 2;
      uVar5 = (ulong)uVar3;
    }
    for (uVar5 = 0; uVar5 < tree->numcodes; uVar5 = uVar5 + 1) {
      uVar6 = (ulong)tree->lengths[uVar5];
      if (uVar6 != 0) {
        uVar3 = nextcode.data[uVar6];
        nextcode.data[uVar6] = uVar3 + 1;
        tree->tree1d[uVar5] = uVar3;
      }
    }
    uivector_cleanup(&blcount);
    uivector_cleanup(&nextcode);
    uVar3 = tree->numcodes;
    uVar5 = (ulong)(uVar3 * 2);
    puVar4 = (uint *)malloc(uVar5 * 4);
    tree->tree2d = puVar4;
    if (puVar4 != (uint *)0x0) {
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        puVar4[uVar6] = 0x7fff;
      }
      uVar6 = 0;
      uVar7 = 0;
      uVar8 = 0;
      do {
        if (uVar6 == uVar3) {
          for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
            if (puVar4[uVar6] == 0x7fff) {
              puVar4[uVar6] = 0;
            }
          }
          return 0;
        }
        puVar2 = tree->lengths;
        uVar9 = 0;
        while (uVar1 = puVar2[uVar6], uVar9 < uVar1) {
          if (uVar3 - 2 < uVar8) {
            return 0x37;
          }
          uVar10 = (uint)((tree->tree1d[uVar6] >> (~uVar9 + uVar1 & 0x1f) & 1) != 0) + uVar8 * 2;
          if (puVar4[uVar10] == 0x7fff) {
            uVar9 = uVar9 + 1;
            if (uVar9 == uVar1) {
              puVar4[uVar10] = (uint)uVar6;
              uVar8 = 0;
              uVar9 = uVar1;
            }
            else {
              uVar8 = uVar7 + 1;
              puVar4[uVar10] = uVar7 + uVar3 + 1;
              uVar7 = uVar8;
            }
          }
          else {
            uVar8 = puVar4[uVar10] - uVar3;
            uVar9 = uVar9 + 1;
          }
        }
        uVar6 = uVar6 + 1;
      } while( true );
    }
  }
  return 0x53;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree)
{
  uivector blcount;
  uivector nextcode;
  unsigned bits, n, error = 0;

  uivector_init(&blcount);
  uivector_init(&nextcode);

  tree->tree1d = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
  if(!tree->tree1d) error = 83; /*alloc fail*/

  if(!uivector_resizev(&blcount, tree->maxbitlen + 1, 0)
  || !uivector_resizev(&nextcode, tree->maxbitlen + 1, 0))
    error = 83; /*alloc fail*/

  if(!error)
  {
    /*step 1: count number of instances of each code length*/
    for(bits = 0; bits < tree->numcodes; bits++) blcount.data[tree->lengths[bits]]++;
    /*step 2: generate the nextcode values*/
    for(bits = 1; bits <= tree->maxbitlen; bits++)
    {
      nextcode.data[bits] = (nextcode.data[bits - 1] + blcount.data[bits - 1]) << 1;
    }
    /*step 3: generate all the codes*/
    for(n = 0; n < tree->numcodes; n++)
    {
      if(tree->lengths[n] != 0) tree->tree1d[n] = nextcode.data[tree->lengths[n]]++;
    }
  }

  uivector_cleanup(&blcount);
  uivector_cleanup(&nextcode);

  if(!error) return HuffmanTree_make2DTree(tree);
  else return error;
}